

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [16];
  long lVar7;
  undefined4 in_register_0000000c;
  float *pfVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  allocator_type local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  
  pfVar8 = (float *)CONCAT44(in_register_0000000c,w);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&display,(long)(y * x),(allocator_type *)&data);
  iVar11 = y * x * 4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,(long)iVar11,&local_61);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1401,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  auVar6 = _DAT_01a2bf40;
  if (0 < iVar11) {
    lVar7 = 0;
    do {
      uVar1 = *(undefined4 *)
               (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + lVar7);
      uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar9;
      auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3[8] = (char)((uint)uVar1 >> 0x10);
      auVar3._0_8_ = uVar9;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar5._5_8_ = 0;
      auVar5._0_5_ = auVar3._8_5_;
      auVar4[4] = (char)((uint)uVar1 >> 8);
      auVar4._0_4_ = (int)uVar9;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar5 << 0x40,6);
      auVar14._0_8_ = (double)(int)uVar9;
      auVar14._8_8_ = (double)auVar4._4_4_;
      auVar13._0_8_ = (double)auVar3._8_4_;
      auVar13._8_8_ = (double)(uint3)(auVar2._10_3_ >> 0x10);
      auVar14 = divpd(auVar14,auVar6);
      auVar13 = divpd(auVar13,auVar6);
      *(ulong *)display.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[(int)lVar7 >> 2].m_data =
           CONCAT44((float)auVar14._8_8_,(float)auVar14._0_8_);
      *(ulong *)(display.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)lVar7 >> 2].m_data + 2) =
           CONCAT44((float)auVar13._8_8_,(float)auVar13._0_8_);
      lVar7 = lVar7 + 4;
    } while (lVar7 < iVar11);
  }
  if (y < 1) {
    bVar12 = true;
  }
  else {
    lVar7 = 0;
    bVar12 = false;
    iVar11 = 0;
    do {
      if (0 < x) {
        uVar9 = 0;
        do {
          iVar10 = (int)lVar7 + (int)uVar9;
          fVar15 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0] - *pfVar8;
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if ((this->g_color_eps).m_data[0] < fVar16) {
LAB_00c1063b:
            anon_unknown_0::Output
                      ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0],
                       SUB84((double)display.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[1],0),
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[2],
                       (double)display.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[3],
                       (double)*pfVar8,(double)pfVar8[1],(double)pfVar8[2],(double)pfVar8[3]);
            goto LAB_00c10680;
          }
          fVar15 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[1] - pfVar8[1];
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if ((this->g_color_eps).m_data[1] < fVar16) goto LAB_00c1063b;
          fVar15 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[2] - pfVar8[2];
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if ((this->g_color_eps).m_data[2] < fVar16) goto LAB_00c1063b;
          fVar15 = display.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[3] - pfVar8[3];
          fVar16 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar16 = fVar15;
          }
          if ((this->g_color_eps).m_data[3] < fVar16) goto LAB_00c1063b;
          uVar9 = uVar9 + 1;
        } while ((uint)x != uVar9);
      }
      iVar11 = iVar11 + 1;
      lVar7 = lVar7 + (ulong)(uint)x;
      bVar12 = y <= iVar11;
    } while (iVar11 != y);
  }
LAB_00c10680:
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(display.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)display.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar12;
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4>	display(w * h);
		std::vector<GLubyte> data(w * h * 4);
		glReadPixels(x, y, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < w * h * 4; i += 4)
		{
			display[i / 4] = vec4(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
								  static_cast<GLfloat>(data[i + 2] / 255.), static_cast<GLfloat>(data[i + 3] / 255.));
		}

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}